

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

void __thiscall
Js::FunctionProxy::RegisterFunctionObjectType(FunctionProxy *this,ScriptFunctionType *functionType)

{
  code *pcVar1;
  FunctionTypeWeakRefList *pFVar2;
  FunctionTypeWeakRefList *pFVar3;
  bool bVar4;
  uint uVar5;
  ScriptFunctionType **ppSVar6;
  undefined4 *puVar7;
  ScriptContext *this_00;
  RecyclerWeakReference<Js::ScriptFunctionType> *local_30;
  FunctionTypeWeakRef *weakRef;
  Recycler *recycler;
  FunctionTypeWeakRefList *typeList;
  ScriptFunctionType *functionType_local;
  FunctionProxy *this_local;
  
  typeList = (FunctionTypeWeakRefList *)functionType;
  functionType_local = (ScriptFunctionType *)this;
  recycler = (Recycler *)EnsureFunctionObjectTypeList(this);
  pFVar2 = typeList;
  ppSVar6 = Memory::WriteBarrierPtr::operator_cast_to_ScriptFunctionType__
                      ((WriteBarrierPtr *)&this->deferredPrototypeType);
  pFVar3 = typeList;
  if ((ScriptFunctionType *)pFVar2 != *ppSVar6) {
    ppSVar6 = Memory::WriteBarrierPtr::operator_cast_to_ScriptFunctionType__
                        ((WriteBarrierPtr *)&this->undeferredFunctionType);
    if ((ScriptFunctionType *)pFVar3 != *ppSVar6) goto LAB_00a1888e;
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar7 = 1;
  bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                              ,0x882,
                              "(functionType != deferredPrototypeType && functionType != undeferredFunctionType)"
                              ,
                              "functionType != deferredPrototypeType && functionType != undeferredFunctionType"
                             );
  if (!bVar4) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar7 = 0;
LAB_00a1888e:
  this_00 = GetScriptContext(this);
  weakRef = (FunctionTypeWeakRef *)ScriptContext::GetRecycler(this_00);
  local_30 = Memory::Recycler::CreateWeakReferenceHandle<Js::ScriptFunctionType>
                       ((Recycler *)weakRef,(ScriptFunctionType *)typeList);
  JsUtil::
  List<Memory::RecyclerWeakReference<Js::ScriptFunctionType>_*,_Memory::Recycler,_false,_Js::WeakRefFreeListedRemovePolicy,_DefaultComparer>
  ::SetAtFirstFreeSpot
            ((List<Memory::RecyclerWeakReference<Js::ScriptFunctionType>_*,_Memory::Recycler,_false,_Js::WeakRefFreeListedRemovePolicy,_DefaultComparer>
              *)recycler,&local_30);
  pFVar2 = typeList;
  uVar5 = JsUtil::
          ReadOnlyList<Memory::RecyclerWeakReference<Js::ScriptFunctionType>_*,_Memory::Recycler,_DefaultComparer>
          ::Count((ReadOnlyList<Memory::RecyclerWeakReference<Js::ScriptFunctionType>_*,_Memory::Recycler,_DefaultComparer>
                   *)recycler);
  Output::Trace(ExpirableCollectPhase,L"Registered type 0x%p on function body %p, count = %d\n",
                pFVar2,this,(ulong)uVar5);
  return;
}

Assistant:

void FunctionProxy::RegisterFunctionObjectType(ScriptFunctionType* functionType)
    {
        FunctionTypeWeakRefList* typeList = EnsureFunctionObjectTypeList();

        Assert(functionType != deferredPrototypeType && functionType != undeferredFunctionType);
        Recycler * recycler = this->GetScriptContext()->GetRecycler();
        FunctionTypeWeakRef* weakRef = recycler->CreateWeakReferenceHandle(functionType);
        typeList->SetAtFirstFreeSpot(weakRef);
        OUTPUT_TRACE(Js::ExpirableCollectPhase, _u("Registered type 0x%p on function body %p, count = %d\n"), functionType, this, typeList->Count());
    }